

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copyto.cpp
# Opt level: O0

void ncnn::copy_to_image<float>(Mat *src,Mat *self,int top,int left)

{
  int iVar1;
  int iVar2;
  int in_ECX;
  int in_EDX;
  long *in_RSI;
  undefined8 *in_RDI;
  int y;
  float *outptr;
  float *ptr;
  int h;
  int w;
  int local_4c;
  void *local_48;
  void *local_40;
  
  iVar1 = *(int *)((long)in_RDI + 0x2c);
  iVar2 = *(int *)(in_RDI + 6);
  local_40 = (void *)*in_RDI;
  local_48 = (void *)(*in_RSI + (long)*(int *)((long)in_RSI + 0x2c) * (long)in_EDX * in_RSI[2] +
                     (long)in_ECX * 4);
  for (local_4c = 0; local_4c < iVar2; local_4c = local_4c + 1) {
    memcpy(local_48,local_40,(long)iVar1 << 2);
    local_40 = (void *)((long)local_40 + (long)iVar1 * 4);
    local_48 = (void *)((long)local_48 + (long)*(int *)((long)in_RSI + 0x2c) * 4);
  }
  return;
}

Assistant:

static void copy_to_image(const Mat& src, Mat& self, int top, int left)
{
    int w = src.w;
    int h = src.h;

    const T* ptr = src;
    T* outptr = self.row<T>(top) + left;

    for (int y = 0; y < h; y++)
    {
        memcpy(outptr, ptr, w * sizeof(T));
        ptr += w;
        outptr += self.w;
    }
}